

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::GetFilenameWithoutExtension
                   (string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  string name;
  
  GetFilenameName(&name,filename);
  lVar1 = std::__cxx11::string::find((char)&name,0x2e);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p == &name.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = name._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(name.field_2._M_allocated_capacity._1_7_,name.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = name._M_string_length;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    name._M_dataplus._M_p = (pointer)&name.field_2;
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&name);
  }
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::GetFilenameWithoutExtension(const kwsys_stl::string& filename)
{
  kwsys_stl::string name = SystemTools::GetFilenameName(filename);
  kwsys_stl::string::size_type dot_pos = name.find('.');
  if(dot_pos != kwsys_stl::string::npos)
    {
    return name.substr(0, dot_pos);
    }
  else
    {
    return name;
    }
}